

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void do_dup_store(TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint32_t dofs,uint32_t oprsz,
                 uint32_t maxsz,TCGv_vec t_vec)

{
  uint local_2c;
  uint32_t i;
  TCGv_vec t_vec_local;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t dofs_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  local_2c = 0;
  if (type == TCG_TYPE_V64) {
    for (; local_2c < oprsz; local_2c = local_2c + 8) {
      tcg_gen_stl_vec_tricore(tcg_ctx,t_vec,tcg_ctx->cpu_env,(ulong)(dofs + local_2c),TCG_TYPE_V64);
    }
  }
  else {
    if (type != TCG_TYPE_V128) {
      if (type != TCG_TYPE_V256) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                   ,0x1cb,(char *)0x0);
      }
      for (; local_2c + 0x20 <= oprsz; local_2c = local_2c + 0x20) {
        tcg_gen_stl_vec_tricore
                  (tcg_ctx,t_vec,tcg_ctx->cpu_env,(ulong)(dofs + local_2c),TCG_TYPE_V256);
      }
    }
    for (; local_2c + 0x10 <= oprsz; local_2c = local_2c + 0x10) {
      tcg_gen_stl_vec_tricore(tcg_ctx,t_vec,tcg_ctx->cpu_env,(ulong)(dofs + local_2c),TCG_TYPE_V128)
      ;
    }
  }
  if (oprsz < maxsz) {
    expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
  }
  return;
}

Assistant:

static void do_dup_store(TCGContext *tcg_ctx, TCGType type, uint32_t dofs, uint32_t oprsz,
                         uint32_t maxsz, TCGv_vec t_vec)
{
    uint32_t i = 0;

    switch (type) {
    case TCG_TYPE_V256:
        /*
         * Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        for (; i + 32 <= oprsz; i += 32) {
            tcg_gen_stl_vec(tcg_ctx, t_vec, tcg_ctx->cpu_env, dofs + i, TCG_TYPE_V256);
        }
        /* fallthru */
    case TCG_TYPE_V128:
        for (; i + 16 <= oprsz; i += 16) {
            tcg_gen_stl_vec(tcg_ctx, t_vec, tcg_ctx->cpu_env, dofs + i, TCG_TYPE_V128);
        }
        break;
    case TCG_TYPE_V64:
        for (; i < oprsz; i += 8) {
            tcg_gen_stl_vec(tcg_ctx, t_vec, tcg_ctx->cpu_env, dofs + i, TCG_TYPE_V64);
        }
        break;
    default:
        g_assert_not_reached();
    }

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}